

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_solve_seq.c
# Opt level: O0

void pnga_lu_solve_seq(char *trans,Integer g_a,Integer g_b)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  undefined8 in_RDI;
  Integer one;
  Integer *adri;
  DoublePrecision *adrb;
  DoublePrecision *adra;
  Integer hi [2];
  Integer lo [2];
  Integer ndim;
  Integer dims [2];
  char *in_stack_00000090;
  long info;
  long blas_dimB2;
  long blas_dimB1;
  long blas_dimA2;
  long blas_dimA1;
  Integer me;
  Integer typeB;
  Integer dimB2;
  Integer dimB1;
  Integer typeA;
  Integer dimA2;
  Integer dimA1;
  logical oactive;
  char *in_stack_fffffffffffffef0;
  long *ld;
  undefined8 in_stack_fffffffffffffef8;
  int type;
  long *buf;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff04;
  Integer *in_stack_ffffffffffffff08;
  long g_a_00;
  long local_98;
  long local_90;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  Integer local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  undefined8 local_8;
  
  type = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  local_80 = 0;
  local_8 = in_RDI;
  local_58 = pnga_nodeid();
  pnga_check_handle(dimA1,(char *)dimA2);
  pnga_check_handle(dimA1,(char *)dimA2);
  pnga_inquire((Integer)trans,(Integer *)g_a,(Integer *)g_b,(Integer *)oactive);
  local_28 = local_98;
  local_30 = local_90;
  pnga_inquire((Integer)trans,(Integer *)g_a,(Integer *)g_b,(Integer *)oactive);
  local_40 = local_98;
  local_48 = local_90;
  if (local_28 == local_30) {
    if (local_28 == local_98) {
      if ((local_38 != 0x3ec) || (local_50 != 0x3ec)) {
        pnga_error(in_stack_00000090,dims[1]);
      }
    }
    else {
      pnga_error(in_stack_00000090,dims[1]);
    }
  }
  else {
    pnga_error(in_stack_00000090,dims[1]);
  }
  pnga_sync();
  local_20 = (long)(int)(uint)(local_58 == 0);
  if (local_20 != 0) {
    pvVar1 = pnga_malloc(CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),type,
                         in_stack_fffffffffffffef0);
    pvVar2 = pnga_malloc(CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),type,
                         in_stack_fffffffffffffef0);
    g_a_00 = local_30;
    if (local_28 <= local_30) {
      g_a_00 = local_28;
    }
    pvVar3 = pnga_malloc(CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),type,
                         in_stack_fffffffffffffef0);
    pnga_get(me,(Integer *)blas_dimA1,(Integer *)blas_dimA2,(void *)blas_dimB1,(Integer *)blas_dimB2
            );
    pnga_get(me,(Integer *)blas_dimA1,(Integer *)blas_dimA2,(void *)blas_dimB1,(Integer *)blas_dimB2
            );
    local_60 = local_28;
    local_68 = local_30;
    local_70 = local_40;
    local_78 = local_48;
    gal_dgetrf_(&local_60,&local_68,pvVar1,&local_60,pvVar3,&local_80);
    if (local_80 == 0) {
      ld = &local_70;
      buf = &local_80;
      uVar4 = 1;
      gal_dgetrs_(local_8,&local_60,&local_78,pvVar1,&local_60,pvVar3,pvVar2);
      if (local_80 == 0) {
        pnga_put(g_a_00,in_stack_ffffffffffffff08,
                 (Integer *)CONCAT44(in_stack_ffffffffffffff04,uVar4),buf,ld);
      }
      else {
        pnga_error(in_stack_00000090,dims[1]);
      }
    }
    else {
      pnga_error(in_stack_00000090,dims[1]);
    }
    pnga_free((void *)0x11dc0f);
    pnga_free((void *)0x11dc19);
    pnga_free((void *)0x11dc23);
  }
  pnga_sync();
  return;
}

Assistant:

void pnga_lu_solve_seq(char *trans, Integer g_a, Integer g_b) {

  logical oactive;  /* true iff this process participates */
  Integer dimA1, dimA2, typeA;
  Integer dimB1, dimB2, typeB;
  Integer me;
#if HAVE_LAPACK || ENABLE_F77
  BlasInt blas_dimA1, blas_dimA2, blas_dimB1, blas_dimB2, info=0;
#else
  Integer info=0;
#endif
  Integer dims[2], ndim;
  Integer lo[2], hi[2];

  /** check environment */
  me     = pnga_nodeid();
  
  /** check GA info for input arrays */
  pnga_check_handle(g_a, "ga_lu_solve: a");
  pnga_check_handle(g_b, "ga_lu_solve: b");
  pnga_inquire(g_a, &typeA, &ndim, dims);
  dimA1 = dims[0];
  dimA2 = dims[1];
  pnga_inquire(g_b, &typeB, &ndim, dims);
  dimB1 = dims[0];
  dimB2 = dims[1];
  

  if (dimA1 != dimA2) 
    pnga_error("ga_lu_solve: g_a must be square matrix ", 1);
  else if(dimA1 != dimB1) 
    pnga_error("ga_lu_solve: dims of A and B do not match ", 1);
  else if(typeA != C_DBL || typeB != C_DBL) 
    pnga_error("ga_lu_solve: wrong type(s) of A and/or B ", 1);
  
  pnga_sync();
  oactive = (me == 0);

  if (oactive) {
    DoublePrecision *adra, *adrb;
    Integer *adri;
    Integer one=1; 

    /** allocate a,b, and work and ipiv arrays */
    adra = (DoublePrecision*) pnga_malloc(dimA1*dimA2, F_DBL, "a");
    adrb = (DoublePrecision*) pnga_malloc(dimB1*dimB2, F_DBL, "b");
    adri = (Integer*) pnga_malloc(GA_MIN(dimA1,dimA2), F_INT, "ipiv");

    /** Fill local arrays from global arrays */   
    lo[0] = one;
    hi[0] = dimA1;
    lo[1] = one;
    hi[1] = dimA2;
    pnga_get(g_a, lo, hi, adra, &dimA1);
    lo[0] = one;
    hi[0] = dimB1;
    lo[1] = one;
    hi[1] = dimB2;
    pnga_get(g_b, lo, hi, adrb, &dimB1);

    /** LU factorization */
#if HAVE_LAPACK || ENABLE_F77
    blas_dimA1 = dimA1;
    blas_dimA2 = dimA2;
    blas_dimB1 = dimB1;
    blas_dimB2 = dimB2;
    LAPACK_DGETRF(&blas_dimA1, &blas_dimA2, adra, &blas_dimA1, (BlasInt*)adri, &info);
#else
    {  int info_t;
      LP_dgefa(adra, (int)dimA1, (int)dimA2, (int*)adri, &info_t);
      info = info_t;
    }
#endif

    /** SOLVE */
    if(info == 0) {
#if HAVE_LAPACK || ENABLE_F77
      LAPACK_DGETRS(trans, &blas_dimA1, &blas_dimB2, adra, &blas_dimA1, 
          (BlasInt*)adri, adrb, &blas_dimB1, &info);
#else
      DoublePrecision *p_b;
      Integer i;
      int job=0;
      if(*trans == 't' || *trans == 'T') job = 1; 
      for(i=0; i<dimB2; i++) {
        p_b = adrb + i*dimB1;
        LP_dgesl(adra, (int)dimA1, (int)dimA2, (int*)adri, p_b, job);
      }
#endif

      if(info == 0) {
        lo[0] = one;
        hi[0] = dimB1;
        lo[1] = one;
        hi[1] = dimB2;
        pnga_put(g_b, lo, hi, adrb, &dimB1);
      } else
        pnga_error(" ga_lu_solve: LP_dgesl failed ", -info);

    }
    else
      pnga_error(" ga_lu_solve: LP_dgefa failed ", -info);

    /** deallocate work arrays */
    pnga_free(adri);
    pnga_free(adrb);
    pnga_free(adra);
  }

  pnga_sync();
  
}